

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,float kappa,float delta,float theta)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  _Head_base<0UL,_int_*,_false> _Var10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  row_iterator prVar15;
  long lVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_register_000012c4 [12];
  undefined1 local_90 [20];
  float local_7c;
  long local_78;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_70;
  _Head_base<0UL,_int_*,_false> local_68;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_60;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_50;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_48;
  ulong local_40;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_38;
  
  _Var6._M_current = (first->current)._M_current;
  local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 8);
  fVar17 = kappa / (1.0 - kappa);
  local_7c = theta;
  local_50 = first;
  local_48._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )last;
  do {
    if (_Var6._M_current ==
        *(int **)local_48._M_t.
                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                 .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                 _M_head_impl) {
      return false;
    }
    lVar14 = (long)_Var6._M_current[-1];
    if (*(int *)(this + 0x80) <= _Var6._M_current[-1]) {
      details::fail_fast("Precondition","k < m",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"186");
    }
    iVar12 = (int)local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
    sparse_matrix<int>::row((sparse_matrix<int> *)local_90,iVar12);
    solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
    ::decrease_preference
              ((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                *)this,(row_iterator)local_90._8_8_,(row_iterator)local_90._0_8_,local_7c);
    uVar13 = 0;
    for (_Var10._M_head_impl = (int *)local_90._8_8_; _Var10._M_head_impl != (int *)local_90._0_8_;
        _Var10._M_head_impl = _Var10._M_head_impl + 2) {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_68,iVar12);
      lVar7 = *(long *)(this + 0x48);
      auVar18 = ZEXT816(0) << 0x40;
      while (local_60._M_t.
             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
             .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl
             != (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                 )local_68._M_head_impl) {
        iVar2 = *(int *)local_60._M_t.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                        _M_head_impl;
        local_60._M_t.
        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
             (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
              )((long)local_60._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                      _M_head_impl + 8);
        auVar19._0_4_ = (float)*(int *)(lVar7 + (long)iVar2 * 4);
        auVar19._4_12_ = in_register_000012c4;
        auVar18 = vfmadd231ss_fma(auVar18,auVar19,
                                  ZEXT416(*(uint *)(*(long *)(this + 0x68) + (long)iVar2 * 4)));
      }
      lVar16 = *(long *)(this + 0x50);
      lVar9 = uVar13 * 0xc;
      *(int *)(lVar16 + 4 + lVar9) = (int)uVar13;
      uVar13 = uVar13 + 1;
      *(undefined4 *)(lVar16 + 8 + lVar9) = *(undefined4 *)(lVar7 + (long)*_Var10._M_head_impl * 4);
      *(float *)(lVar16 + lVar9) =
           *(float *)(*(long *)(*(long *)(this + 0x70) + 8) + (long)*(int *)(local_90._8_8_ + 4) * 4
                     ) - auVar18._0_4_;
    }
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*>
              (*(rc_data **)(this + 0x50),*(rc_data **)(this + 0x50) + (uVar13 & 0xffffffff),
               *(random_engine **)this);
    lVar7 = *(long *)(this + 0x58);
    local_70._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )(lVar14 * 0xc);
    local_78 = lVar14;
    local_40 = uVar13;
    if (*(int *)(lVar7 + (long)local_70._M_t.
                               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                               .
                               super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                               ._M_head_impl) < 1) {
      iVar12 = 0;
      uVar13 = 0xffffffffffffffff;
LAB_00147e85:
      bVar5 = iVar12 <= *(int *)(lVar7 + 4 +
                                (long)local_70._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                      ._M_head_impl);
    }
    else {
      lVar16 = -0x100000000;
      lVar9 = 0;
      local_38._M_head_impl = (col_value *)(long)((int)uVar13 + -2);
      lVar14 = *(long *)(this + 0x50);
      iVar12 = 0;
      lVar7 = -1;
      do {
        uVar4 = local_90._8_8_;
        iVar12 = iVar12 + *(int *)(lVar14 + 8 + lVar9);
        lVar16 = lVar16 + 0x100000000;
        iVar2 = *(int *)(lVar14 + 4 + lVar9);
        iVar3 = *(int *)(*(long *)(this + 0x58) +
                        (long)local_70._M_t.
                              super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                              ._M_head_impl);
        bit_array_impl::set(&x->super_bit_array_impl,
                            ((row_iterator)(local_90._8_8_ + (long)iVar2 * 8))->column);
        lVar14 = *(long *)(this + 0x50);
        auVar18 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(lVar14 + lVar9) * 0.5)),
                                  ZEXT416((uint)fVar17),ZEXT416((uint)delta));
        *(float *)(*(long *)(this + 0x68) +
                  (long)((row_iterator)(uVar4 + (long)iVar2 * 8))->value * 4) =
             auVar18._0_4_ +
             *(float *)(*(long *)(this + 0x68) +
                       (long)((row_iterator)(uVar4 + (long)iVar2 * 8))->value * 4);
        if (iVar3 <= iVar12) break;
        lVar9 = lVar9 + 0xc;
        bVar5 = lVar7 < (long)local_38._M_head_impl;
        lVar7 = lVar7 + 1;
      } while (bVar5);
      lVar7 = *(long *)(this + 0x58);
      uVar13 = lVar16 >> 0x20;
      if (*(int *)(lVar7 + (long)local_70._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                 ._M_head_impl) <= iVar12) goto LAB_00147e85;
      bVar5 = false;
    }
    uVar8 = (ulong)(int)(size_type)local_40;
    lVar14 = uVar13 * 0xc;
    uVar11 = uVar13;
    while( true ) {
      lVar7 = local_78;
      uVar11 = uVar11 + 1;
      uVar13 = uVar13 + 1;
      if ((uVar8 <= uVar13) || (!bVar5)) break;
      lVar7 = *(long *)(this + 0x50);
      iVar12 = iVar12 + *(int *)(lVar7 + 0x14 + lVar14);
      if (iVar12 < *(int *)(*(long *)(this + 0x58) +
                           (long)local_70._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                 ._M_head_impl)) {
        prVar15 = (row_iterator)(local_90._8_8_ + (long)*(int *)(lVar7 + 0x10 + lVar14) * 8);
LAB_00147f48:
        bit_array_impl::unset(&x->super_bit_array_impl,prVar15->column);
        auVar18 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc + lVar14) *
                                                0.5)),ZEXT416((uint)fVar17),ZEXT416((uint)delta));
        *(float *)(*(long *)(this + 0x68) + (long)prVar15->value * 4) =
             *(float *)(*(long *)(this + 0x68) + (long)prVar15->value * 4) - auVar18._0_4_;
        bVar5 = false;
      }
      else {
        prVar15 = (row_iterator)(local_90._8_8_ + (long)*(int *)(lVar7 + 0x10 + lVar14) * 8);
        if ((*(int *)(*(long *)(this + 0x58) +
                      (long)local_70._M_t.
                            super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                            .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                            ._M_head_impl + 4) < iVar12) ||
           (bVar5 = stop_iterating<baryonyx::itm::minimize_tag,float>
                              (*(float *)(lVar7 + 0xc + lVar14),*(random_engine **)this), !bVar5))
        goto LAB_00147f48;
        bit_array_impl::set(&x->super_bit_array_impl,prVar15->column);
        auVar18 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc + lVar14) *
                                                0.5)),ZEXT416((uint)fVar17),ZEXT416((uint)delta));
        *(float *)(*(long *)(this + 0x68) + (long)prVar15->value * 4) =
             auVar18._0_4_ + *(float *)(*(long *)(this + 0x68) + (long)prVar15->value * 4);
        bVar5 = true;
      }
      lVar14 = lVar14 + 0xc;
    }
    while (uVar4 = local_90._8_8_, uVar11 < uVar8) {
      iVar12 = *(int *)(*(long *)(this + 0x50) + 0x10 + lVar14);
      bit_array_impl::unset
                (&x->super_bit_array_impl,
                 ((row_iterator)(local_90._8_8_ + (long)iVar12 * 8))->column);
      uVar11 = uVar11 + 1;
      pfVar1 = (float *)(*(long *)(this + 0x50) + 0xc + lVar14);
      lVar14 = lVar14 + 0xc;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar1 * 0.5)),ZEXT416((uint)fVar17),
                                ZEXT416((uint)delta));
      *(float *)(*(long *)(this + 0x68) +
                (long)((row_iterator)(uVar4 + (long)iVar12 * 8))->value * 4) =
           *(float *)(*(long *)(this + 0x68) +
                     (long)((row_iterator)(uVar4 + (long)iVar12 * 8))->value * 4) - auVar18._0_4_;
    }
    bVar5 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>,baryonyx::bit_array>
                      ((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                        *)this,(int)lVar7,x);
    if (!bVar5) {
      details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"335");
    }
    _Var6._M_current = (local_50->current)._M_current + -1;
    (local_50->current)._M_current = _Var6._M_current;
  } while( true );
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }